

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_1172c1::Number<wchar_t>::~Number(Number<wchar_t> *this)

{
  uint uVar1;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Number_001f1eb0;
  uVar1 = this->base_;
  if ((uVar1 < 0x11) && ((0x10500U >> (uVar1 & 0x1f) & 1) != 0)) {
    pstore::dump::number_base::default_base_ = uVar1;
    std::__cxx11::wostringstream::~wostringstream((wostringstream *)&this->out_);
    std::ios_base::~ios_base((ios_base *)&this->field_0x80);
    testing::Test::~Test(&this->super_Test);
    return;
  }
  pstore::assert_failed
            ("false",
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/dump/test_number.cpp"
             ,0x2a);
}

Assistant:

~Number () override {
            using namespace ::pstore::dump;
            switch (base_) {
            case 8: number_base::oct (); break;
            case 10: number_base::dec (); break;
            case 16: number_base::hex (); break;
            default: PSTORE_ASSERT (false); break;
            }
        }